

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles2::Functional::eval_selection_ivec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector<int,_4> res;
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  fVar3 = c->in[1].m_data[2];
  fVar4 = c->in[1].m_data[3];
  if (c->in[0].m_data[2] <= 0.0) {
    fVar4 = c->in[2].m_data[0];
    fVar1 = c->in[2].m_data[1];
    fVar2 = c->in[2].m_data[2];
    fVar3 = c->in[2].m_data[3];
  }
  (c->color).m_data[0] = (float)(int)fVar4;
  (c->color).m_data[1] = (float)(int)fVar3;
  (c->color).m_data[2] = (float)(int)fVar2;
  (c->color).m_data[3] = (float)(int)fVar1;
  return;
}

Assistant:

void eval_selection_ivec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(3, 2, 1, 0).asInt(),	c.in[2].swizzle(0, 3, 2, 1).asInt()).asFloat(); }